

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

vector<Edge_*,_std::allocator<Edge_*>_> * __thiscall
RealCommandRunner::GetActiveEdges
          (vector<Edge_*,_std::allocator<Edge_*>_> *__return_storage_ptr__,RealCommandRunner *this)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_30;
  _Self local_28;
  iterator e;
  RealCommandRunner *this_local;
  vector<Edge_*,_std::allocator<Edge_*>_> *edges;
  
  e._M_node._7_1_ = 0;
  std::vector<Edge_*,_std::allocator<Edge_*>_>::vector(__return_storage_ptr__);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<const_Subprocess_*,_Edge_*,_std::less<const_Subprocess_*>,_std::allocator<std::pair<const_Subprocess_*const,_Edge_*>_>_>
       ::begin(&this->subproc_to_edge_);
  while( true ) {
    local_30._M_node =
         (_Base_ptr)
         std::
         map<const_Subprocess_*,_Edge_*,_std::less<const_Subprocess_*>,_std::allocator<std::pair<const_Subprocess_*const,_Edge_*>_>_>
         ::end(&this->subproc_to_edge_);
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_Subprocess_*const,_Edge_*>_>::operator->
                       (&local_28);
    std::vector<Edge_*,_std::allocator<Edge_*>_>::push_back(__return_storage_ptr__,&ppVar2->second);
    std::_Rb_tree_iterator<std::pair<const_Subprocess_*const,_Edge_*>_>::operator++(&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Edge*> RealCommandRunner::GetActiveEdges() {
  vector<Edge*> edges;
  for (map<const Subprocess*, Edge*>::iterator e = subproc_to_edge_.begin();
       e != subproc_to_edge_.end(); ++e)
    edges.push_back(e->second);
  return edges;
}